

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

vec3 __thiscall polyscope::SlicePlane::getCenter(SlicePlane *this)

{
  bool bVar1;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec3 vVar5;
  vec3 vVar6;
  
  bVar1 = (this->active).value;
  aVar2.z = (uint)(bVar1 & 1) * (this->objectTransform).value.value[3].field_2;
  if (bVar1 == false) {
    vVar5._0_8_ = SUB648(ZEXT464(0x7f800000),0);
    vVar5.field_2 = aVar2;
    return vVar5;
  }
  uVar3 = (this->objectTransform).value.value[3].field_0;
  uVar4 = (this->objectTransform).value.value[3].field_1;
  vVar6.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar4;
  vVar6.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)uVar3;
  vVar6.field_2 = aVar2;
  return vVar6;
}

Assistant:

glm::vec3 SlicePlane::getCenter() {
  if (active.get()) {
    glm::vec3 center{objectTransform.get()[3][0], objectTransform.get()[3][1], objectTransform.get()[3][2]};
    return center;
  } else {
    // Put it really far away so tests always pass
    return glm::vec3{std::numeric_limits<float>::infinity(), 0., 0.};
  }
}